

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O3

void __thiscall
QParallelAnimationGroupPrivate::disconnectUncontrolledAnimations
          (QParallelAnimationGroupPrivate *this)

{
  ulong uVar1;
  Data *pDVar2;
  ulong uVar3;
  
  pDVar2 = (this->uncontrolledFinishTime).d;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
    uVar3 = 0;
LAB_003a82df:
    if (pDVar2 == (Data *)0x0 && uVar3 == 0) goto LAB_003a8377;
  }
  else {
    if (pDVar2->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (pDVar2->numBuckets == uVar3) {
          pDVar2 = (Data *)0x0;
          uVar3 = 0;
          break;
        }
        uVar1 = uVar3 + 1;
      } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
      goto LAB_003a82df;
    }
    uVar3 = 0;
  }
  do {
    QObject::disconnect(*(QObject **)
                         pDVar2->spans[uVar3 >> 7].entries
                         [pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.data,
                        (char *)0x0,
                        (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                        super_QObjectPrivate.super_QObjectData.q_ptr,
                        "1_q_uncontrolledAnimationFinished()");
    do {
      if (pDVar2->numBuckets - 1 == uVar3) {
        pDVar2 = (Data *)0x0;
        uVar3 = 0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  } while ((pDVar2 != (Data *)0x0) || (uVar3 != 0));
LAB_003a8377:
  QHash<QAbstractAnimation_*,_int>::clear(&this->uncontrolledFinishTime);
  return;
}

Assistant:

void QParallelAnimationGroupPrivate::disconnectUncontrolledAnimations()
{
    for (AnimationTimeHashConstIt it = uncontrolledFinishTime.constBegin(), cend = uncontrolledFinishTime.constEnd(); it != cend; ++it)
        disconnectUncontrolledAnimation(it.key());

    uncontrolledFinishTime.clear();
}